

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.hpp
# Opt level: O2

void __thiscall
quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::
make_facet<std::_List_const_iterator<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>>>
          (quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>
           *this,facet *_facet,
          _List_const_iterator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
          sbeg,size_type _vertex,bool _swap)

{
  pointer p_Var1;
  pointer p_Var2;
  _Fwd_list_node_base *p_Var3;
  pointer puVar4;
  pointer puVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong local_38;
  
  std::
  vector<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
  ::reserve(&_facet->vertices_,*(size_type *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&_facet->neighbours_,*(size_type *)this);
  local_38 = 0;
  while( true ) {
    uVar7 = *(ulong *)this;
    if (uVar7 < local_38) break;
    uVar7 = _vertex;
    if (local_38 != _vertex) {
      std::
      vector<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
      ::push_back(&_facet->vertices_,(value_type *)(sbeg._M_node + 1));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&_facet->neighbours_,&local_38);
      uVar7 = local_38;
    }
    sbeg._M_node = (sbeg._M_node)->_M_next;
    local_38 = uVar7 + 1;
  }
  if ((bool)((char)uVar7 - (char)_vertex & 1U) != _swap) {
    p_Var1 = (_facet->vertices_).
             super__Vector_base<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var2 = (_facet->vertices_).
             super__Vector_base<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    p_Var3 = p_Var1->_M_node;
    p_Var1->_M_node = p_Var2[-1]._M_node;
    p_Var2[-1]._M_node = p_Var3;
    puVar4 = (_facet->neighbours_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (_facet->neighbours_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = *puVar4;
    *puVar4 = puVar5[-1];
    puVar5[-1] = uVar6;
    uVar7 = *(ulong *)this;
  }
  std::vector<double,_std::allocator<double>_>::resize(&_facet->normal_,uVar7);
  return;
}

Assistant:

void
    make_facet(facet & _facet,
               iterator sbeg, // simplex
               size_type const _vertex,
               bool const _swap)
    {
        using iterator_traits = std::iterator_traits< iterator >;
        static_assert(std::is_base_of< std::input_iterator_tag, typename iterator_traits::iterator_category >::value);
        static_assert(std::is_constructible< point_iterator, typename iterator_traits::value_type >::value);
        _facet.vertices_.reserve(dimension_);
        _facet.neighbours_.reserve(dimension_);
        for (size_type v = 0; v <= dimension_; ++v) {
            if (v != _vertex) {
                _facet.vertices_.push_back(*sbeg);
                _facet.neighbours_.push_back(v);
            }
            ++sbeg;
        }
        if (_swap == (((dimension_ - _vertex) % 2) == 0)) {
            using std::swap;
            swap(_facet.vertices_.front(), _facet.vertices_.back());
            swap(_facet.neighbours_.front(), _facet.neighbours_.back());
        }
        _facet.normal_.resize(dimension_);
    }